

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O2

string * qpModelStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,QpModelStatus qp_model_status)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(qp_model_status) {
  case kNotset:
    pcVar2 = "Not set";
    paVar1 = &local_9;
    break;
  case kUndetermined:
    pcVar2 = "Undetermined";
    paVar1 = &local_a;
    break;
  case kOptimal:
    pcVar2 = "Optimal";
    paVar1 = &local_b;
    break;
  case kUnbounded:
    pcVar2 = "Unbounded";
    paVar1 = &local_c;
    break;
  case kInfeasible:
    pcVar2 = "Infeasible";
    paVar1 = &local_d;
    break;
  case kIterationLimit:
    pcVar2 = "Iteration limit";
    paVar1 = &local_e;
    break;
  case kTimeLimit:
    pcVar2 = "Time ;limit";
    paVar1 = &local_f;
    break;
  case kLargeNullspace:
    pcVar2 = "Large nullspace";
    paVar1 = &local_10;
    break;
  default:
    pcVar2 = "Unidentified QP model status";
    paVar1 = &local_12;
    break;
  case kError:
    pcVar2 = "Error";
    paVar1 = &local_11;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string qpModelStatusToString(const QpModelStatus qp_model_status) {
  switch (qp_model_status) {
    case QpModelStatus::kNotset:
      return "Not set";
    case QpModelStatus::kUndetermined:
      return "Undetermined";
    case QpModelStatus::kOptimal:
      return "Optimal";
    case QpModelStatus::kUnbounded:
      return "Unbounded";
    case QpModelStatus::kInfeasible:
      return "Infeasible";
    case QpModelStatus::kIterationLimit:
      return "Iteration limit";
    case QpModelStatus::kTimeLimit:
      return "Time ;limit";
    case QpModelStatus::kLargeNullspace:
      return "Large nullspace";
    case QpModelStatus::kError:
      return "Error";
    default:
      return "Unidentified QP model status";
  }
}